

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall llvm::cl::Option::removeArgument(Option *this)

{
  SmallPtrSet<llvm::cl::SubCommand_*,_4U> *this_00;
  bool bVar1;
  CommandLineParser *pCVar2;
  SubCommand *pSVar3;
  SubCommand *SC;
  SubCommand *SC_00;
  SubCommand *SC_01;
  SmallPtrSet<llvm::cl::SubCommand_*,_4U> *__range4;
  void **ppvVar4;
  SmallPtrSetIteratorImpl SVar5;
  iterator iVar6;
  iterator __begin4;
  SmallPtrSetIteratorImpl local_38;
  
  pCVar2 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                         *)this);
  if ((this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
      NumNonEmpty ==
      (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
      NumTombstones) {
    pSVar3 = ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
             ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                          *)TopLevelSubCommand);
    anon_unknown.dwarf_23af3b::CommandLineParser::removeOption
              ((CommandLineParser *)this,(Option *)pSVar3,SC);
    return;
  }
  this_00 = &this->Subs;
  bVar1 = any_of<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>const&,llvm::cl::Option::isInAllSubCommands()const::_lambda(llvm::cl::SubCommand_const*)_1_>
                    (this_00);
  if (bVar1) {
    SVar5 = (SmallPtrSetIteratorImpl)
            SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                      (&(pCVar2->RegisteredSubCommands).
                        super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
    local_38 = SVar5;
    iVar6 = SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                      (&(pCVar2->RegisteredSubCommands).
                        super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
    ppvVar4 = SVar5.Bucket;
    while (ppvVar4 != iVar6.super_SmallPtrSetIteratorImpl.Bucket) {
      pSVar3 = SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*
                         ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)&local_38);
      anon_unknown.dwarf_23af3b::CommandLineParser::removeOption
                ((CommandLineParser *)this,(Option *)pSVar3,SC_00);
      SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++
                ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)&local_38);
      ppvVar4 = local_38.Bucket;
    }
  }
  else {
    SVar5 = (SmallPtrSetIteratorImpl)
            SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                      (&this_00->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
    local_38 = SVar5;
    iVar6 = SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                      (&this_00->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
    ppvVar4 = SVar5.Bucket;
    while (ppvVar4 != iVar6.super_SmallPtrSetIteratorImpl.Bucket) {
      pSVar3 = SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*
                         ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)&local_38);
      anon_unknown.dwarf_23af3b::CommandLineParser::removeOption
                ((CommandLineParser *)this,(Option *)pSVar3,SC_01);
      SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++
                ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)&local_38);
      ppvVar4 = local_38.Bucket;
    }
  }
  return;
}

Assistant:

void Option::removeArgument() { GlobalParser->removeOption(this); }